

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uint64_t mode;
  uint64_t size;
  uv_fs_t stat_req;
  uv_fs_t *req_local;
  
  stat_req.bufsml[3].len = (size_t)req;
  if ((long)req->fs_type != 0x1e) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x35,"req->fs_type","==","UV_FS_COPYFILE",(long)req->fs_type,"==",0x1e);
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x36,"req->result","==","0",req->result,"==",0);
    abort();
  }
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)&size,req->path,(uv_fs_cb)0x0);
  uVar2 = stat_req.statbuf.st_ino;
  uVar1 = stat_req.statbuf.st_dev;
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x3a,"r","==","0",(long)iVar3,"==",0);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&size);
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)&size,"test_file_dst",(uv_fs_cb)0x0);
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x3f,"r","==","0",(long)iVar3,"==",0);
    abort();
  }
  if (stat_req.statbuf.st_ino != uVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x40,"stat_req.statbuf.st_size","==","size",stat_req.statbuf.st_ino,"==",uVar2);
    abort();
  }
  if (stat_req.statbuf.st_dev != uVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x41,"stat_req.statbuf.st_mode","==","mode",stat_req.statbuf.st_dev,"==",uVar1);
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)&size);
  uv_fs_req_cleanup((uv_fs_t *)stat_req.bufsml[3].len);
  result_check_count = result_check_count + 1;
  return;
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT_EQ(req->fs_type, UV_FS_COPYFILE);
  ASSERT_OK(req->result);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT_OK(r);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(stat_req.statbuf.st_size, size);
  ASSERT_EQ(stat_req.statbuf.st_mode, mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}